

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O3

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextSawtoothCosineLogSample
          (LA32WaveGenerator *this,LogSample *logSample)

{
  uint uVar1;
  uint uVar2;
  Tables *pTVar3;
  uint uVar4;
  
  uVar1 = this->wavePosition;
  pTVar3 = Tables::getInstance();
  uVar4 = uVar1 >> 9 & 0x1ff;
  uVar2 = uVar4 ^ 0x1ff;
  if ((uVar1 >> 0x12 & 1) != 0) {
    uVar2 = uVar4;
  }
  logSample->logValue = pTVar3->logsin9[uVar2] << 2;
  logSample->sign = uVar1 + 0x40000 >> 0x13 & NEGATIVE;
  return;
}

Assistant:

void LA32WaveGenerator::generateNextSawtoothCosineLogSample(LogSample &logSample) const {
	Bit32u sawtoothCosinePosition = wavePosition + (1 << 18);
	if ((sawtoothCosinePosition & (1 << 18)) > 0) {
		logSample.logValue = Tables::getInstance().logsin9[~(sawtoothCosinePosition >> 9) & 511];
	} else {
		logSample.logValue = Tables::getInstance().logsin9[(sawtoothCosinePosition >> 9) & 511];
	}
	logSample.logValue <<= 2;
	logSample.sign = ((sawtoothCosinePosition & (1 << 19)) == 0) ? LogSample::POSITIVE : LogSample::NEGATIVE;
}